

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxFindPath_rec(Str_Mux_t *pMux,int *pPath,int *pnLength)

{
  int b;
  int iVar1;
  int local_2c;
  int DelayMax;
  int i;
  int *pnLength_local;
  int *pPath_local;
  Str_Mux_t *pMux_local;
  
  iVar1 = pMux->Edge[0].FanDel;
  b = Abc_MaxInt(pMux->Edge[1].FanDel,pMux->Edge[2].FanDel);
  iVar1 = Abc_MaxInt(iVar1,b);
  local_2c = 0;
  while( true ) {
    if (1 < local_2c) {
      if (pMux->Edge[2].FanDel == iVar1) {
        return 0;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x658,"int Str_MuxFindPath_rec(Str_Mux_t *, int *, int *)");
    }
    if (pMux->Edge[local_2c].FanDel == iVar1) break;
    local_2c = local_2c + 1;
  }
  iVar1 = Str_MuxFindPathEdge_rec(pMux,local_2c,pPath,pnLength);
  return iVar1;
}

Assistant:

int Str_MuxFindPath_rec( Str_Mux_t * pMux, int * pPath, int * pnLength )
{
    int i, DelayMax = Abc_MaxInt( pMux->Edge[0].FanDel, Abc_MaxInt(pMux->Edge[1].FanDel, pMux->Edge[2].FanDel) );
    for ( i = 0; i < 2; i++ )
        if ( pMux->Edge[i].FanDel == DelayMax )
            return Str_MuxFindPathEdge_rec( pMux, i, pPath, pnLength );
    if ( pMux->Edge[2].FanDel == DelayMax )
        return 0;
    assert( 0 );
    return -1;
}